

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O0

void qp_free(priority_queue *qp,_func_void_void_ptr *payload_free)

{
  ulong local_20;
  size_t i;
  _func_void_void_ptr *payload_free_local;
  priority_queue *qp_local;
  
  if (qp != (priority_queue *)0x0) {
    if (qp->size < qp->count) {
      __assert_fail("qp->count <= qp->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-queue.c"
                    ,0x114,"void qp_free(struct priority_queue *, void (*)(void *))");
    }
    if (payload_free != (_func_void_void_ptr *)0x0) {
      for (local_20 = 0; local_20 < qp->count; local_20 = local_20 + 1) {
        (*payload_free)(qp->data[local_20].payload.p);
      }
    }
    mem_free(qp->data);
    mem_free(qp);
  }
  return;
}

Assistant:

void qp_free(struct priority_queue *qp, void (*payload_free)(void*))
{
	if (!qp) {
		return;
	}
	assert(qp->count <= qp->size);
	if (payload_free) {
		size_t i;

		for (i = 0; i < qp->count; ++i) {
			(*payload_free)(qp->data[i].payload.p);
		}
	}
	mem_free(qp->data);
	mem_free(qp);
}